

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O2

void __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::rotateLeft(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
             *this,RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *x)

{
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **ppRVar3;
  
  pRVar1 = (x->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_right;
  pRVar2 = (pRVar1->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left;
  (x->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_right = pRVar2;
  if (pRVar2 != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (pRVar2->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = x;
  }
  pRVar2 = (x->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent;
  (pRVar1->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_parent = pRVar2;
  if (pRVar2 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    ppRVar3 = &this->m_root;
  }
  else {
    ppRVar3 = &(pRVar2->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_right;
    if ((pRVar2->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left == x) {
      ppRVar3 = &(pRVar2->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_left;
    }
  }
  *ppRVar3 = pRVar1;
  (pRVar1->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_left = x;
  (x->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).m_parent = pRVar1;
  return;
}

Assistant:

void
	rotateLeft(Node* x) {
		Node* y = x->m_right;
		ASSERT(y);

		x->m_right = y->m_left;

		if (y->m_left)
			y->m_left->m_parent = x;

		y->m_parent = x->m_parent;

		if (!x->m_parent)
			m_root = y;
		else if (x == x->m_parent->m_left)
			x->m_parent->m_left = y;
		else
			x->m_parent->m_right = y;

		y->m_left = x;
		x->m_parent = y;
	}